

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O0

string_view bloaty::ReadUntil(string_view *data,char c)

{
  int __c;
  const_pointer __s;
  size_type __n;
  void *pvVar1;
  const_pointer pvVar2;
  char in_SIL;
  basic_string_view<char,_std::char_traits<char>_> *in_RDI;
  basic_string_view<char,_std::char_traits<char>_> bVar3;
  string_view sVar4;
  size_t len;
  char *found;
  string_view val;
  undefined8 local_48;
  undefined4 in_stack_ffffffffffffffc8;
  
  __s = std::basic_string_view<char,_std::char_traits<char>_>::data(in_RDI);
  __c = (int)in_SIL;
  __n = std::basic_string_view<char,_std::char_traits<char>_>::size(in_RDI);
  pvVar1 = memchr(__s,__c,__n);
  if (pvVar1 == (void *)0x0) {
    local_48 = (basic_string_view<char,_std::char_traits<char>_> *)
               std::basic_string_view<char,_std::char_traits<char>_>::size(in_RDI);
  }
  else {
    pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::data(in_RDI);
    local_48 = (basic_string_view<char,_std::char_traits<char>_> *)((long)pvVar1 - (long)pvVar2);
  }
  bVar3 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                    (local_48,CONCAT44(__c,in_stack_ffffffffffffffc8),(size_type)__s);
  std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix(in_RDI,(size_type)local_48);
  sVar4._M_len = bVar3._M_len;
  sVar4._M_str = bVar3._M_str;
  return sVar4;
}

Assistant:

std::string_view ReadUntil(std::string_view* data, char c) {
  const char* found =
      static_cast<const char*>(memchr(data->data(), c, data->size()));

  size_t len = (found == NULL) ? data->size() : (found - data->data());
  std::string_view val = data->substr(0, len);
  data->remove_prefix(len);
  return val;
}